

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 matchOther)

{
  u8 uVar1;
  byte bVar2;
  bool bVar3;
  u32 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uchar *puVar8;
  size_t sVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  u8 *puVar13;
  u32 uVar14;
  u32 uVar15;
  uint uVar16;
  byte *pbVar17;
  bool bVar18;
  u8 *local_68;
  byte local_5b;
  uchar local_5a;
  uchar local_59;
  byte *local_58;
  u32 local_4c;
  compareInfo *local_48;
  u32 local_3c;
  u8 *local_38;
  
  uVar11 = (uint)pInfo->matchOne;
  uVar1 = pInfo->noCase;
  local_38 = (u8 *)0x0;
  local_3c = (u32)pInfo->matchAll;
  uVar16 = (uint)pInfo->matchAll;
  local_68 = zPattern;
  local_58 = zString;
  local_4c = matchOther;
  local_48 = pInfo;
LAB_00136242:
  uVar14 = (u32)(char)*local_68;
  if ((char)*local_68 < '\0') {
    uVar14 = sqlite3Utf8Read(&local_68);
  }
  else {
    local_68 = local_68 + 1;
  }
  if (uVar14 == 0) {
    return (uint)(*local_58 != 0);
  }
  if (uVar14 != uVar16) {
    if (uVar14 == local_4c) goto code_r0x00136284;
    goto LAB_0013630f;
  }
  while( true ) {
    uVar14 = (u32)(char)*local_68;
    if ((char)*local_68 < '\0') {
      uVar14 = sqlite3Utf8Read(&local_68);
    }
    else {
      local_68 = local_68 + 1;
    }
    if (uVar14 != uVar11 && uVar14 != uVar16) break;
    if ((uVar14 == uVar11) && (uVar14 = sqlite3Utf8Read(&local_58), uVar14 == 0)) {
      return 2;
    }
  }
  if (uVar14 == 0) {
    return 0;
  }
  if (uVar14 == local_4c) {
    if (local_48->matchSet != '\0') {
      puVar13 = local_68 + -1;
      pbVar17 = local_58;
      iVar7 = 1;
      do {
        bVar2 = *pbVar17;
        if (bVar2 == 0) {
          return 2;
        }
        iVar6 = patternCompare(puVar13,pbVar17,local_48,local_4c);
        iVar12 = iVar6;
        if (iVar6 == 1) {
          iVar12 = iVar7;
          if (bVar2 < 0xc0) {
            pbVar17 = pbVar17 + 1;
          }
          else {
            pbVar17 = pbVar17 + 1;
          }
        }
        iVar7 = iVar12;
      } while (iVar6 == 1);
      return iVar12;
    }
    uVar14 = sqlite3Utf8Read(&local_68);
    if (uVar14 == 0) {
      return 2;
    }
  }
  puVar13 = local_68;
  if (0x80 < uVar14) {
    while( true ) {
      uVar15 = (u32)(char)*local_58;
      if ((char)*local_58 < '\0') {
        uVar15 = sqlite3Utf8Read(&local_58);
      }
      else {
        local_58 = local_58 + 1;
      }
      if (uVar15 == 0) break;
      if ((uVar15 == uVar14) &&
         (iVar7 = patternCompare(puVar13,local_58,local_48,local_4c), iVar7 != 1)) {
LAB_001365b4:
        if (uVar15 == 0) {
          return 2;
        }
        return iVar7;
      }
    }
    iVar7 = 1;
    goto LAB_001365b4;
  }
  local_5b = (byte)uVar14;
  if (uVar1 == '\0') {
    puVar8 = &local_5a;
  }
  else {
    local_5b = local_5b & (~""[uVar14] | 0xdf);
    local_5a = ""[uVar14];
    puVar8 = &local_59;
  }
  *puVar8 = '\0';
  pbVar17 = local_58;
  do {
    sVar9 = strcspn((char *)pbVar17,(char *)&local_5b);
    bVar2 = pbVar17[sVar9];
    if (bVar2 == 0) {
      iVar7 = 1;
      break;
    }
    pbVar17 = pbVar17 + sVar9 + 1;
    iVar7 = patternCompare(puVar13,pbVar17,local_48,local_4c);
  } while (iVar7 == 1);
  if (bVar2 == 0) {
    return 2;
  }
  return iVar7;
code_r0x001363e8:
  uVar4 = sqlite3Utf8Read(&local_68);
  bVar3 = true;
  if (uVar4 < uVar14) {
    bVar3 = bVar10;
  }
  if (uVar15 <= uVar14) {
    bVar10 = bVar3;
  }
  goto LAB_00136395;
code_r0x00136284:
  if (local_48->matchSet != '\0') {
    uVar14 = sqlite3Utf8Read(&local_58);
    if (uVar14 == 0) {
      return 1;
    }
    uVar4 = sqlite3Utf8Read(&local_68);
    uVar15 = 0;
    bVar18 = uVar4 == 0x5e;
    if (bVar18) {
      uVar4 = sqlite3Utf8Read(&local_68);
    }
    bVar10 = false;
    if (uVar4 != 0x5d) goto LAB_001363a4;
    bVar10 = uVar14 == 0x5d;
LAB_00136395:
    uVar15 = 0;
LAB_00136397:
    uVar4 = sqlite3Utf8Read(&local_68);
LAB_001363a4:
    if (uVar4 == 0x2d) {
      if ((*local_68 != ']') && (uVar15 != 0 && *local_68 != '\0')) goto code_r0x001363e8;
    }
    else {
      if (uVar4 == 0x5d) {
        uVar16 = local_3c;
        if (bVar10 == bVar18) {
          return 1;
        }
        goto LAB_00136242;
      }
      if (uVar4 == 0) {
        return 1;
      }
    }
    uVar15 = uVar4;
    if (uVar14 == uVar4) {
      bVar10 = true;
    }
    goto LAB_00136397;
  }
  uVar14 = sqlite3Utf8Read(&local_68);
  if (uVar14 != 0) {
    local_38 = local_68;
LAB_0013630f:
    uVar5 = (uint)(char)*local_58;
    if ((char)*local_58 < '\0') {
      uVar5 = sqlite3Utf8Read(&local_58);
    }
    else {
      local_58 = local_58 + 1;
    }
    if ((uVar14 == uVar5) ||
       (((uVar1 != '\0' && ((uVar5 | uVar14) < 0x80)) && (""[uVar14 & 0xff] == ""[uVar5 & 0xff]))))
    goto LAB_00136242;
    if (uVar14 == uVar11) {
      if (uVar5 == 0) {
        return 1;
      }
      if (local_68 == local_38) {
        return 1;
      }
      goto LAB_00136242;
    }
  }
  return 1;
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 matchOther                   /* The escape char (LIKE) or '[' (GLOB) */
){
  u32 c, c2;                       /* Next pattern and input string chars */
  u32 matchOne = pInfo->matchOne;  /* "?" or "_" */
  u32 matchAll = pInfo->matchAll;  /* "*" or "%" */
  u8 noCase = pInfo->noCase;       /* True if uppercase==lowercase */
  const u8 *zEscaped = 0;          /* One past the last escaped input char */
  
  while( (c = Utf8Read(zPattern))!=0 ){
    if( c==matchAll ){  /* Match "*" */
      /* Skip over multiple "*" characters in the pattern.  If there
      ** are also "?" characters, skip those as well, but consume a
      ** single character of the input string for each "?" skipped */
      while( (c=Utf8Read(zPattern)) == matchAll || c == matchOne ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return SQLITE_NOWILDCARDMATCH;
        }
      }
      if( c==0 ){
        return SQLITE_MATCH;   /* "*" at the end of the pattern matches */
      }else if( c==matchOther ){
        if( pInfo->matchSet==0 ){
          c = sqlite3Utf8Read(&zPattern);
          if( c==0 ) return SQLITE_NOWILDCARDMATCH;
        }else{
          /* "[...]" immediately follows the "*".  We have to do a slow
          ** recursive search in this case, but it is an unusual case. */
          assert( matchOther<0x80 );  /* '[' is a single-byte character */
          while( *zString ){
            int bMatch = patternCompare(&zPattern[-1],zString,pInfo,matchOther);
            if( bMatch!=SQLITE_NOMATCH ) return bMatch;
            SQLITE_SKIP_UTF8(zString);
          }
          return SQLITE_NOWILDCARDMATCH;
        }
      }

      /* At this point variable c contains the first character of the
      ** pattern string past the "*".  Search in the input string for the
      ** first matching character and recursively continue the match from
      ** that point.
      **
      ** For a case-insensitive search, set variable cx to be the same as
      ** c but in the other case and search the input string for either
      ** c or cx.
      */
      if( c<=0x80 ){
        char zStop[3];
        int bMatch;
        if( noCase ){
          zStop[0] = sqlite3Toupper(c);
          zStop[1] = sqlite3Tolower(c);
          zStop[2] = 0;
        }else{
          zStop[0] = c;
          zStop[1] = 0;
        }
        while(1){
          zString += strcspn((const char*)zString, zStop);
          if( zString[0]==0 ) break;
          zString++;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }else{
        int bMatch;
        while( (c2 = Utf8Read(zString))!=0 ){
          if( c2!=c ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }
      return SQLITE_NOWILDCARDMATCH;
    }
    if( c==matchOther ){
      if( pInfo->matchSet==0 ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ) return SQLITE_NOMATCH;
        zEscaped = zPattern;
      }else{
        u32 prior_c = 0;
        int seen = 0;
        int invert = 0;
        c = sqlite3Utf8Read(&zString);
        if( c==0 ) return SQLITE_NOMATCH;
        c2 = sqlite3Utf8Read(&zPattern);
        if( c2=='^' ){
          invert = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==']' ){
          if( c==']' ) seen = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        while( c2 && c2!=']' ){
          if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
            c2 = sqlite3Utf8Read(&zPattern);
            if( c>=prior_c && c<=c2 ) seen = 1;
            prior_c = 0;
          }else{
            if( c==c2 ){
              seen = 1;
            }
            prior_c = c2;
          }
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==0 || (seen ^ invert)==0 ){
          return SQLITE_NOMATCH;
        }
        continue;
      }
    }
    c2 = Utf8Read(zString);
    if( c==c2 ) continue;
    if( noCase  && sqlite3Tolower(c)==sqlite3Tolower(c2) && c<0x80 && c2<0x80 ){
      continue;
    }
    if( c==matchOne && zPattern!=zEscaped && c2!=0 ) continue;
    return SQLITE_NOMATCH;
  }
  return *zString==0 ? SQLITE_MATCH : SQLITE_NOMATCH;
}